

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_is_strict_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  uVar2 = roaring_bitmap_get_cardinality(r2);
  uVar3 = roaring_bitmap_get_cardinality(r1);
  if (uVar3 < uVar2) {
    _Var1 = roaring_bitmap_is_subset(r1,r2);
    return _Var1;
  }
  return false;
}

Assistant:

bool roaring_bitmap_is_strict_subset(const roaring_bitmap_t *r1,
                                     const roaring_bitmap_t *r2) {
    return (roaring_bitmap_get_cardinality(r2) >
                roaring_bitmap_get_cardinality(r1) &&
            roaring_bitmap_is_subset(r1, r2));
}